

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O2

void google::protobuf::internal::MapMergeFrom<unsigned_int,proto2_unittest::TestIntIntMap>
               (Map<unsigned_int,_proto2_unittest::TestIntIntMap> *dest,
               Map<unsigned_int,_proto2_unittest::TestIntIntMap> *src)

{
  TestIntIntMap *this;
  TestIntIntMap *from;
  const_iterator __begin0;
  UntypedMapIterator local_30;
  
  UntypedMapBase::begin(&local_30,(UntypedMapBase *)src);
  while (local_30.node_ != (NodeBase *)0x0) {
    from = (TestIntIntMap *)(local_30.node_ + 2);
    this = Map<unsigned_int,_proto2_unittest::TestIntIntMap>::operator[]<unsigned_int>
                     (dest,(key_arg<unsigned_int> *)(local_30.node_ + 1));
    proto2_unittest::TestIntIntMap::CopyFrom(this,from);
    UntypedMapIterator::PlusPlus(&local_30);
  }
  return;
}

Assistant:

PROTOBUF_NOINLINE void MapMergeFrom(Map<T...>& dest, const Map<T...>& src) {
  for (const auto& elem : src) {
    dest[elem.first] = elem.second;
  }
}